

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O3

void __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::SetObjectiveTo<mip_converter_test::MIPInstanceBackend>
          (FlatModel<mp::DefaultFlatModelParams> *this,MIPInstanceBackend *backend,int i,
          QuadraticObjective *obj)

{
  if (-1 < (obj->super_NLObjective).expr_) {
    BasicFlatModelAPI::SetNLObjective(&backend->super_BasicFlatModelAPI,i,&obj->super_NLObjective);
    return;
  }
  if ((obj->qt_).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0) {
    BasicFlatModelAPI::SetQuadraticObjective(&backend->super_BasicFlatModelAPI,i,obj);
    return;
  }
  mip_converter_test::MIPInstanceBackend::SetLinearObjective(backend,i,(LinearObjective *)obj);
  return;
}

Assistant:

void SetObjectiveTo(
      Backend& backend, int i, const QuadraticObjective& obj) const {
    if (obj.HasExpr()) {
      assert(obj.GetQPTerms().empty());     // not mixing qudratics and expr
      backend.SetNLObjective(i, obj);
    } else if (obj.GetQPTerms().size())
      backend.SetQuadraticObjective(i, obj);
    else
      backend.SetLinearObjective(i, obj);
  }